

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonTests.cc
# Opt level: O2

test_suite * init_unit_test_suite(int argc,char **argv)

{
  test_suite *this;
  size_t sVar1;
  test_case *ptVar2;
  test_unit_generator par_end;
  const_string local_1a8;
  const_string local_198;
  const_string local_188;
  const_string local_178;
  const_string local_168;
  const_string local_158;
  const_string local_148;
  const_string local_138;
  const_string local_128;
  const_string local_118;
  const_string local_108;
  const_string local_f8;
  const_string local_e8;
  char *local_d8;
  char *local_d0;
  const_string local_c8;
  char *local_b8;
  char *local_b0;
  const_string local_a8;
  char *local_98;
  char *local_90;
  const_string local_88;
  char *local_78;
  char *local_70;
  const_string local_68;
  const_string local_58;
  const_string local_48;
  const_string local_38;
  
  this = (test_suite *)operator_new(0x180);
  local_38.m_begin = "Avro C++ unit tests for json routines";
  sVar1 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    ("Avro C++ unit tests for json routines");
  local_38.m_end = "Avro C++ unit tests for json routines" + sVar1;
  local_48.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  sVar1 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
                    );
  local_48.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
       + sVar1;
  boost::unit_test::test_suite::test_suite(this,&local_38,&local_48,0xbc);
  par_end._vptr_test_unit_generator = (_func_int **)0x0;
  boost::function0<void>::assign_to<void(*)()>
            ((function0<void> *)&stack0xfffffffffffffde0,avro::json::testNull);
  local_58.m_begin = "&avro::json::testNull";
  local_58.m_end = "";
  local_68.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  sVar1 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
                    );
  local_68.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
       + sVar1;
  ptVar2 = boost::unit_test::make_test_case
                     ((function<void_()> *)&stack0xfffffffffffffde0,&local_58,&local_68,0xbe);
  boost::unit_test::test_suite::add(this,&ptVar2->super_test_unit,0,0);
  boost::function0<void>::~function0((function0<void> *)&stack0xfffffffffffffde0);
  local_78 = "&avro::json::testBool";
  local_70 = "";
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  sVar1 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
                    );
  local_88.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
       + sVar1;
  boost::unit_test::make_test_case<avro::json::TestData<bool>const&,avro::json::TestData<bool>*>
            ((param_test_case_generator<avro::json::TestData<bool>,_avro::json::TestData<bool>_*> *)
             &stack0xfffffffffffffde0,(unit_test *)avro::json::testBool,
             (_func_void_TestData<bool>_ptr *)&local_78,&local_88,(const_string *)0xc1,0x1d7520,
             (TestData<bool> *)avro::json::longData,
             (TestData<bool> *)par_end._vptr_test_unit_generator);
  boost::unit_test::test_suite::add(this,(test_unit_generator *)&stack0xfffffffffffffde0,0);
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::json::TestData<bool>,_avro::json::TestData<bool>_*>::
  ~param_test_case_generator
            ((param_test_case_generator<avro::json::TestData<bool>,_avro::json::TestData<bool>_*> *)
             &stack0xfffffffffffffde0);
  local_98 = "&avro::json::testLong";
  local_90 = "";
  local_a8.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  sVar1 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
                    );
  local_a8.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
       + sVar1;
  boost::unit_test::make_test_case<avro::json::TestData<long>const&,avro::json::TestData<long>*>
            ((param_test_case_generator<avro::json::TestData<long>,_avro::json::TestData<long>_*> *)
             &stack0xfffffffffffffde0,(unit_test *)avro::json::testLong,
             (_func_void_TestData<long>_ptr *)&local_98,&local_a8,(const_string *)0xc4,0x1d7540,
             (TestData<long> *)&DAT_001d75b8,(TestData<long> *)par_end._vptr_test_unit_generator);
  boost::unit_test::test_suite::add(this,(test_unit_generator *)&stack0xfffffffffffffde0,0);
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::json::TestData<long>,_avro::json::TestData<long>_*>::
  ~param_test_case_generator
            ((param_test_case_generator<avro::json::TestData<long>,_avro::json::TestData<long>_*> *)
             &stack0xfffffffffffffde0);
  local_b8 = "&avro::json::testDouble";
  local_b0 = "";
  local_c8.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  sVar1 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
                    );
  local_c8.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
       + sVar1;
  boost::unit_test::make_test_case<avro::json::TestData<double>const&,avro::json::TestData<double>*>
            ((param_test_case_generator<avro::json::TestData<double>,_avro::json::TestData<double>_*>
              *)&stack0xfffffffffffffde0,(unit_test *)avro::json::testDouble,
             (_func_void_TestData<double>_ptr *)&local_b8,&local_c8,(const_string *)0xc7,0x1d75c0,
             (TestData<double> *)&DAT_001d7638,(TestData<double> *)par_end._vptr_test_unit_generator
            );
  boost::unit_test::test_suite::add(this,(test_unit_generator *)&stack0xfffffffffffffde0,0);
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::json::TestData<double>,_avro::json::TestData<double>_*>::
  ~param_test_case_generator
            ((param_test_case_generator<avro::json::TestData<double>,_avro::json::TestData<double>_*>
              *)&stack0xfffffffffffffde0);
  local_d8 = "&avro::json::testString";
  local_d0 = "";
  local_e8.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  sVar1 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
                    );
  local_e8.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
       + sVar1;
  boost::unit_test::
  make_test_case<avro::json::TestData<char_const*>const&,avro::json::TestData<char_const*>*>
            ((param_test_case_generator<avro::json::TestData<const_char_*>,_avro::json::TestData<const_char_*>_*>
              *)&stack0xfffffffffffffde0,(unit_test *)avro::json::testString,
             (_func_void_TestData<const_char_ptr>_ptr *)&local_d8,&local_e8,(const_string *)0xca,
             0x1d7640,(TestData<const_char_*> *)
                      boost::debug::anon_unknown_0::prepare_gdb_cmnd_file::cmd_file_name,
             (TestData<const_char_*> *)par_end._vptr_test_unit_generator);
  boost::unit_test::test_suite::add(this,(test_unit_generator *)&stack0xfffffffffffffde0,0);
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::json::TestData<const_char_*>,_avro::json::TestData<const_char_*>_*>
  ::~param_test_case_generator
            ((param_test_case_generator<avro::json::TestData<const_char_*>,_avro::json::TestData<const_char_*>_*>
              *)&stack0xfffffffffffffde0);
  boost::function0<void>::assign_to<void(*)()>
            ((function0<void> *)&stack0xfffffffffffffde0,avro::json::testArray0);
  local_f8.m_begin = "&avro::json::testArray0";
  local_f8.m_end = "";
  local_108.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  sVar1 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
                    );
  local_108.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
       + sVar1;
  ptVar2 = boost::unit_test::make_test_case
                     ((function<void_()> *)&stack0xfffffffffffffde0,&local_f8,&local_108,0xcc);
  boost::unit_test::test_suite::add(this,&ptVar2->super_test_unit,0,0);
  boost::function0<void>::~function0((function0<void> *)&stack0xfffffffffffffde0);
  boost::function0<void>::assign_to<void(*)()>
            ((function0<void> *)&stack0xfffffffffffffde0,avro::json::testArray1);
  local_118.m_begin = "&avro::json::testArray1";
  local_118.m_end = "";
  local_128.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  sVar1 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
                    );
  local_128.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
       + sVar1;
  ptVar2 = boost::unit_test::make_test_case
                     ((function<void_()> *)&stack0xfffffffffffffde0,&local_118,&local_128,0xcd);
  boost::unit_test::test_suite::add(this,&ptVar2->super_test_unit,0,0);
  boost::function0<void>::~function0((function0<void> *)&stack0xfffffffffffffde0);
  boost::function0<void>::assign_to<void(*)()>
            ((function0<void> *)&stack0xfffffffffffffde0,avro::json::testArray2);
  local_138.m_begin = "&avro::json::testArray2";
  local_138.m_end = "";
  local_148.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  sVar1 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
                    );
  local_148.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
       + sVar1;
  ptVar2 = boost::unit_test::make_test_case
                     ((function<void_()> *)&stack0xfffffffffffffde0,&local_138,&local_148,0xce);
  boost::unit_test::test_suite::add(this,&ptVar2->super_test_unit,0,0);
  boost::function0<void>::~function0((function0<void> *)&stack0xfffffffffffffde0);
  boost::function0<void>::assign_to<void(*)()>
            ((function0<void> *)&stack0xfffffffffffffde0,avro::json::testObject0);
  local_158.m_begin = "&avro::json::testObject0";
  local_158.m_end = "";
  local_168.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  sVar1 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
                    );
  local_168.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
       + sVar1;
  ptVar2 = boost::unit_test::make_test_case
                     ((function<void_()> *)&stack0xfffffffffffffde0,&local_158,&local_168,0xd0);
  boost::unit_test::test_suite::add(this,&ptVar2->super_test_unit,0,0);
  boost::function0<void>::~function0((function0<void> *)&stack0xfffffffffffffde0);
  boost::function0<void>::assign_to<void(*)()>
            ((function0<void> *)&stack0xfffffffffffffde0,avro::json::testObject1);
  local_178.m_begin = "&avro::json::testObject1";
  local_178.m_end = "";
  local_188.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  sVar1 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
                    );
  local_188.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
       + sVar1;
  ptVar2 = boost::unit_test::make_test_case
                     ((function<void_()> *)&stack0xfffffffffffffde0,&local_178,&local_188,0xd1);
  boost::unit_test::test_suite::add(this,&ptVar2->super_test_unit,0,0);
  boost::function0<void>::~function0((function0<void> *)&stack0xfffffffffffffde0);
  boost::function0<void>::assign_to<void(*)()>
            ((function0<void> *)&stack0xfffffffffffffde0,avro::json::testObject2);
  local_198.m_begin = "&avro::json::testObject2";
  local_198.m_end = "";
  local_1a8.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  sVar1 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
                    );
  local_1a8.m_end =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
       + sVar1;
  ptVar2 = boost::unit_test::make_test_case
                     ((function<void_()> *)&stack0xfffffffffffffde0,&local_198,&local_1a8,0xd2);
  boost::unit_test::test_suite::add(this,&ptVar2->super_test_unit,0,0);
  boost::function0<void>::~function0((function0<void> *)&stack0xfffffffffffffde0);
  return this;
}

Assistant:

boost::unit_test::test_suite*
init_unit_test_suite( int argc, char* argv[] ) 
{
    using namespace boost::unit_test;

    test_suite* ts= BOOST_TEST_SUITE("Avro C++ unit tests for json routines");

    ts->add(BOOST_TEST_CASE(&avro::json::testNull));
    ts->add(BOOST_PARAM_TEST_CASE(&avro::json::testBool,
        avro::json::boolData,
        avro::json::boolData + COUNTOF(avro::json::boolData)));
    ts->add(BOOST_PARAM_TEST_CASE(&avro::json::testLong,
        avro::json::longData,
        avro::json::longData + COUNTOF(avro::json::longData)));
    ts->add(BOOST_PARAM_TEST_CASE(&avro::json::testDouble,
        avro::json::doubleData,
        avro::json::doubleData + COUNTOF(avro::json::doubleData)));
    ts->add(BOOST_PARAM_TEST_CASE(&avro::json::testString,
        avro::json::stringData,
        avro::json::stringData + COUNTOF(avro::json::stringData)));

    ts->add(BOOST_TEST_CASE(&avro::json::testArray0));
    ts->add(BOOST_TEST_CASE(&avro::json::testArray1));
    ts->add(BOOST_TEST_CASE(&avro::json::testArray2));

    ts->add(BOOST_TEST_CASE(&avro::json::testObject0));
    ts->add(BOOST_TEST_CASE(&avro::json::testObject1));
    ts->add(BOOST_TEST_CASE(&avro::json::testObject2));

    return ts;
}